

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS ref_facelift_tattle(REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_GEOM ref_geom;
  REF_FACELIFT ref_facelift;
  REF_DBL *pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_INT RVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  REF_INT tuv_sense;
  REF_INT cell;
  REF_DBL faceuv [2];
  REF_DBL params [2];
  REF_DBL xyz [3];
  REF_DBL bary [3];
  REF_INT linear_nodes [27];
  REF_INT tri_nodes [27];
  REF_INT local_180;
  REF_INT local_17c;
  REF_DBL local_178;
  undefined8 local_170;
  REF_DBL local_168;
  REF_DBL local_160;
  REF_DBL local_158;
  undefined8 local_150;
  undefined8 local_148;
  REF_DBL local_138;
  undefined8 local_130;
  undefined8 local_128;
  REF_INT local_118;
  undefined8 local_114;
  REF_INT local_10c;
  REF_INT local_a8;
  undefined8 local_a4;
  
  ref_geom = ref_grid->geom;
  ref_facelift = ref_geom->ref_facelift;
  if ((ref_facelift != (REF_FACELIFT)0x0) && (ref_facelift->displacement == (REF_DBL *)0x0)) {
    pRVar2 = ref_grid->node->real;
    lVar7 = (long)(node * 0xf);
    printf(" facelift tattle on node = %d at %f %f %f\n",pRVar2[lVar7],pRVar2[lVar7 + 1],
           pRVar2[lVar7 + 2]);
    uVar8 = 0xffffffff;
    if (-1 < node) {
      uVar8 = 0xffffffff;
      if (node < ref_geom->ref_adj->nnode) {
        uVar8 = (ulong)(uint)ref_geom->ref_adj->first[(uint)node];
      }
    }
    if ((int)uVar8 != -1) {
      RVar4 = ref_geom->ref_adj->item[(int)uVar8].ref;
      do {
        iVar1 = ref_geom->descr[RVar4 * 6];
        uVar6 = ref_geom->descr[RVar4 * 6 + 1];
        if (iVar1 == 2) {
          local_168 = ref_geom->param[RVar4 * 2];
          local_160 = ref_geom->param[RVar4 * 2 + 1];
          uVar5 = ref_facelift_eval_at(ref_facelift,2,uVar6,&local_168,&local_158,(REF_DBL *)0x0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0xde,"ref_facelift_tattle",(ulong)uVar5,"eval");
            return uVar5;
          }
          uVar5 = ref_facelift_enclosing(ref_facelift,2,uVar6,&local_168,&local_17c,&local_138);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0xe0,"ref_facelift_tattle",(ulong)uVar5,"enclose");
            return uVar5;
          }
          printf("tri id %d xyz %f %f %f uv %f %f\n",local_158,local_150,local_148,local_168,
                 local_160,(ulong)uVar6);
          uVar6 = ref_cell_nodes(ref_facelift->tri_cell,local_17c,&local_a8);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0xe4,"ref_facelift_tattle",(ulong)uVar6,"edg tri nodes");
            return uVar6;
          }
          local_118 = local_a8;
          local_114 = local_a4;
          local_10c = (&local_a8)[ref_facelift->tri_cell->node_per];
          uVar6 = ref_geom_cell_tuv(ref_geom,local_a8,&local_118,2,&local_178,&local_180);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0xec,"ref_facelift_tattle",(ulong)uVar6,"face uv");
            return uVar6;
          }
          printf("bary[0] %f uv %f %f\n",local_138,local_178,local_170);
          uVar6 = ref_geom_cell_tuv(ref_geom,(REF_INT)local_114,&local_118,2,&local_178,&local_180);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0xf0,"ref_facelift_tattle",(ulong)uVar6,"face uv");
            return uVar6;
          }
          printf("bary[1] %f uv %f %f\n",local_130,local_178,local_170);
          uVar6 = ref_geom_cell_tuv(ref_geom,local_114._4_4_,&local_118,2,&local_178,&local_180);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0xf4,"ref_facelift_tattle",(ulong)uVar6);
            return uVar6;
          }
          printf("bary[2] %f uv %f %f\n",local_128,local_178,local_170);
        }
        else if (iVar1 == 1) {
          local_168 = ref_geom->param[RVar4 * 2];
          uVar5 = ref_facelift_eval_at(ref_facelift,1,uVar6,&local_168,&local_158,(REF_DBL *)0x0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0xd4,"ref_facelift_tattle",(ulong)uVar5,"eval");
            return uVar5;
          }
          uVar5 = ref_facelift_enclosing(ref_facelift,1,uVar6,&local_168,&local_17c,&local_138);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0xd6,"ref_facelift_tattle",(ulong)uVar5);
            return uVar5;
          }
          printf("edg id %d xyz %f %f %f bary %f %f\n",local_158,local_150,local_148,local_138,
                 local_130,(ulong)uVar6);
        }
        pRVar3 = ref_geom->ref_adj->item;
        iVar1 = pRVar3[(int)uVar8].next;
        uVar8 = (ulong)iVar1;
        if (uVar8 == 0xffffffffffffffff) {
          RVar4 = -1;
        }
        else {
          RVar4 = pRVar3[uVar8].ref;
        }
      } while (iVar1 != -1);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_tattle(REF_GRID ref_grid, REF_INT node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_FACELIFT ref_facelift = ref_geom_facelift(ref_geom);
  REF_INT item, geom;
  REF_INT type, id;
  REF_DBL params[2];
  REF_DBL bary[3];
  REF_INT cell;
  REF_DBL xyz[3], faceuv[2];
  REF_INT linear_nodes[REF_CELL_MAX_SIZE_PER], tuv_sense;
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];

  if (NULL == ref_facelift) return REF_SUCCESS;
  if (!ref_facelift_direct(ref_facelift)) return REF_SUCCESS;

  printf(" facelift tattle on node = %d at %f %f %f\n", node,
         ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
         ref_node_xyz(ref_node, 2, node));
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    type = ref_geom_type(ref_geom, geom);
    id = ref_geom_id(ref_geom, geom);
    switch (type) {
      case REF_GEOM_EDGE:
        params[0] = ref_geom_param(ref_geom, 0, geom);
        RSS(ref_facelift_eval_at(ref_facelift, type, id, params, xyz, NULL),
            "eval");
        RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
            "enclose");
        printf("edg id %d xyz %f %f %f bary %f %f\n", id, xyz[0], xyz[1],
               xyz[2], bary[0], bary[1]);
        break;
      case REF_GEOM_FACE:
        params[0] = ref_geom_param(ref_geom, 0, geom);
        params[1] = ref_geom_param(ref_geom, 1, geom);
        RSS(ref_facelift_eval_at(ref_facelift, type, id, params, xyz, NULL),
            "eval");
        RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
            "enclose");
        printf("tri id %d xyz %f %f %f uv %f %f\n", id, xyz[0], xyz[1], xyz[2],
               params[0], params[1]);
        RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), cell, tri_nodes),
            "edg tri nodes");
        linear_nodes[0] = tri_nodes[0];
        linear_nodes[1] = tri_nodes[1];
        linear_nodes[2] = tri_nodes[2];
        linear_nodes[3] =
            tri_nodes[ref_cell_id_index(ref_facelift_tri(ref_facelift))];
        RSS(ref_geom_cell_tuv(ref_geom, linear_nodes[0], linear_nodes,
                              REF_GEOM_FACE, faceuv, &tuv_sense),
            "face uv");
        printf("bary[0] %f uv %f %f\n", bary[0], faceuv[0], faceuv[1]);
        RSS(ref_geom_cell_tuv(ref_geom, linear_nodes[1], linear_nodes,
                              REF_GEOM_FACE, faceuv, &tuv_sense),
            "face uv");
        printf("bary[1] %f uv %f %f\n", bary[1], faceuv[0], faceuv[1]);
        RSS(ref_geom_cell_tuv(ref_geom, linear_nodes[2], linear_nodes,
                              REF_GEOM_FACE, faceuv, &tuv_sense),
            "face uv");
        printf("bary[2] %f uv %f %f\n", bary[2], faceuv[0], faceuv[1]);

        break;
    }
  }

  return REF_SUCCESS;
}